

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O0

void __thiscall
ZXing::Pdf417::DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers
          (DetectionResultColumn *this,BarcodeMetadata *barcodeMetadata)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ResultPoint *pRVar7;
  reference pvVar8;
  int *piVar9;
  BarcodeMetadata *in_RSI;
  DetectionResultColumn *in_RDI;
  int i;
  bool closePreviousCodewordFound;
  int checkedRows;
  int rowDifference;
  Codeword codeword;
  int codewordsRow;
  int increment;
  int currentRowHeight;
  int maxRowHeight;
  int barcodeRow;
  int lastRow;
  int firstRow;
  Nullable<ZXing::ResultPoint> bottom;
  Nullable<ZXing::ResultPoint> top;
  BoundingBox *bb;
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  *codewords;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  Nullable<ZXing::Pdf417::Codeword> *in_stack_ffffffffffffff80;
  int local_6c;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  int iVar10;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar11;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffb7;
  Nullable<ZXing::ResultPoint> local_38;
  BoundingBox *local_20;
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  *local_18;
  BarcodeMetadata *local_10;
  
  local_10 = in_RSI;
  bVar2 = isRowIndicator(in_RDI);
  if (bVar2) {
    local_18 = allCodewords(in_RDI);
    setRowNumbers((DetectionResultColumn *)
                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    isLeftRowIndicator(in_RDI);
    RemoveIncorrectCodewords
              ((bool)in_stack_ffffffffffffffb7,
               (vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (BarcodeMetadata *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_20 = boundingBox(in_RDI);
    bVar2 = isLeftRowIndicator(in_RDI);
    if (bVar2) {
      BoundingBox::topLeft(&local_38,local_20);
    }
    else {
      BoundingBox::topRight(&local_38,local_20);
    }
    bVar2 = isLeftRowIndicator(in_RDI);
    if (bVar2) {
      BoundingBox::bottomLeft((Nullable<ZXing::ResultPoint> *)&stack0xffffffffffffffb0,local_20);
    }
    else {
      BoundingBox::bottomRight((Nullable<ZXing::ResultPoint> *)&stack0xffffffffffffffb0,local_20);
    }
    pRVar7 = Nullable<ZXing::ResultPoint>::value(&local_38);
    ResultPoint::y(pRVar7);
    local_6c = imageRowToCodewordIndex
                         ((DetectionResultColumn *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
    pRVar7 = Nullable<ZXing::ResultPoint>::value
                       ((Nullable<ZXing::ResultPoint> *)&stack0xffffffffffffffb0);
    ResultPoint::y(pRVar7);
    iVar3 = imageRowToCodewordIndex
                      ((DetectionResultColumn *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
    iVar11 = -1;
    iVar10 = 1;
    local_64 = 0;
    local_68 = 1;
    for (; local_6c < iVar3; local_6c = local_6c + 1) {
      pvVar8 = std::
               vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
               ::operator[](local_18,(long)local_6c);
      bVar2 = ZXing::operator==(pvVar8,(nullptr_t)0x0);
      if (!bVar2) {
        std::
        vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
        ::operator[](local_18,(long)local_6c);
        Nullable::operator_cast_to_Codeword(in_stack_ffffffffffffff80);
        if (iVar11 == -1) {
          iVar4 = Codeword::rowNumber((Codeword *)&stack0xffffffffffffff80);
          iVar5 = BarcodeMetadata::rowCount(local_10);
          if (iVar4 == iVar5 + -1) {
            local_68 = -1;
            iVar11 = BarcodeMetadata::rowCount(local_10);
          }
        }
        iVar4 = Codeword::rowNumber((Codeword *)&stack0xffffffffffffff80);
        iVar4 = iVar4 - iVar11;
        if (iVar4 == 0) {
          local_64 = local_64 + 1;
        }
        else if (iVar4 == local_68) {
          piVar9 = std::max<int>((int *)&stack0xffffffffffffffa0,&local_64);
          iVar10 = *piVar9;
          local_64 = 1;
          iVar11 = Codeword::rowNumber((Codeword *)&stack0xffffffffffffff80);
        }
        else {
          if (-1 < iVar4) {
            iVar5 = Codeword::rowNumber((Codeword *)&stack0xffffffffffffff80);
            iVar6 = BarcodeMetadata::rowCount(local_10);
            if ((iVar5 < iVar6) && (iVar4 <= local_6c)) {
              in_stack_ffffffffffffff78 = iVar4;
              if (2 < iVar10) {
                in_stack_ffffffffffffff78 = (iVar10 + -2) * iVar4;
              }
              bVar2 = local_6c <= in_stack_ffffffffffffff78;
              iVar5 = 1;
              while( true ) {
                bVar1 = 0;
                if (iVar5 <= in_stack_ffffffffffffff78) {
                  bVar1 = bVar2 ^ 0xff;
                }
                if ((bVar1 & 1) == 0) break;
                pvVar8 = std::
                         vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                         ::operator[](local_18,(long)(local_6c - iVar5));
                bVar2 = ZXing::operator!=(pvVar8,(nullptr_t)0x0);
                iVar5 = iVar5 + 1;
              }
              if (bVar2 == false) {
                iVar11 = Codeword::rowNumber((Codeword *)&stack0xffffffffffffff80);
                local_64 = 1;
              }
              else {
                std::
                vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                ::operator[](local_18,(long)local_6c);
                Nullable<ZXing::Pdf417::Codeword>::operator=
                          (in_stack_ffffffffffffff80,
                           (nullptr_t)CONCAT44(iVar4,in_stack_ffffffffffffff78));
              }
              goto LAB_002c4c45;
            }
          }
          std::
          vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
          ::operator[](local_18,(long)local_6c);
          Nullable<ZXing::Pdf417::Codeword>::operator=
                    (in_stack_ffffffffffffff80,(nullptr_t)CONCAT44(iVar4,in_stack_ffffffffffffff78))
          ;
        }
      }
LAB_002c4c45:
    }
  }
  return;
}

Assistant:

void
DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers(const BarcodeMetadata& barcodeMetadata)
{
	if (!isRowIndicator()) {
		return;
	}

	auto& codewords = allCodewords();
	setRowNumbers();
	RemoveIncorrectCodewords(isLeftRowIndicator(), codewords, barcodeMetadata);
	const auto& bb = boundingBox();
	auto top = isLeftRowIndicator() ? bb.topLeft() : bb.topRight();
	auto bottom = isLeftRowIndicator() ? bb.bottomLeft() : bb.bottomRight();
	int firstRow = imageRowToCodewordIndex((int)top.value().y());
	int lastRow = imageRowToCodewordIndex((int)bottom.value().y());
	// We need to be careful using the average row height. Barcode could be skewed so that we have smaller and
	// taller rows
	//float averageRowHeight = (lastRow - firstRow) / (float)barcodeMetadata.rowCount();
	int barcodeRow = -1;
	int maxRowHeight = 1;
	int currentRowHeight = 0;
	int increment = 1;
	for (int codewordsRow = firstRow; codewordsRow < lastRow; codewordsRow++) {
		if (codewords[codewordsRow] == nullptr) {
			continue;
		}
		Codeword codeword = codewords[codewordsRow];
		if (barcodeRow == -1 && codeword.rowNumber() == barcodeMetadata.rowCount() - 1) {
			increment = -1;
			barcodeRow = barcodeMetadata.rowCount();
		}
		//      float expectedRowNumber = (codewordsRow - firstRow) / averageRowHeight;
		//      if (Math.abs(codeword.getRowNumber() - expectedRowNumber) > 2) {
		//        SimpleLog.log(LEVEL.WARNING,
		//            "Removing codeword, rowNumberSkew too high, codeword[" + codewordsRow + "]: Expected Row: " +
		//                expectedRowNumber + ", RealRow: " + codeword.getRowNumber() + ", value: " + codeword.getValue());
		//        codewords[codewordsRow] = null;
		//      }

		int rowDifference = codeword.rowNumber() - barcodeRow;

		if (rowDifference == 0) {
			currentRowHeight++;
		}
		else if (rowDifference == increment) {
			maxRowHeight = std::max(maxRowHeight, currentRowHeight);
			currentRowHeight = 1;
			barcodeRow = codeword.rowNumber();
		}
		else if (rowDifference < 0 ||
			codeword.rowNumber() >= barcodeMetadata.rowCount() ||
			rowDifference > codewordsRow) {
			codewords[codewordsRow] = nullptr;
		}
		else {
			int checkedRows;
			if (maxRowHeight > 2) {
				checkedRows = (maxRowHeight - 2) * rowDifference;
			}
			else {
				checkedRows = rowDifference;
			}
			bool closePreviousCodewordFound = checkedRows >= codewordsRow;
			for (int i = 1; i <= checkedRows && !closePreviousCodewordFound; i++) {
				// there must be (height * rowDifference) number of codewords missing. For now we assume height = 1.
				// This should hopefully get rid of most problems already.
				closePreviousCodewordFound = codewords[codewordsRow - i] != nullptr;
			}
			if (closePreviousCodewordFound) {
				codewords[codewordsRow] = nullptr;
			}
			else {
				barcodeRow = codeword.rowNumber();
				currentRowHeight = 1;
			}
		}
	}
	//return static_cast<int>(averageRowHeight + 0.5);
}